

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitConstantArgsToFltArray
               (ByteCodeGenerator *byteCodeGenerator,double *vars,ParseNode *args,uint argCount)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeInt *pPVar6;
  ParseNodeFloat *pPVar7;
  ulong uVar8;
  double dVar9;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar8 = 0;
  while( true ) {
    OVar1 = args->nop;
    if ((OVar1 != knopList) || (argCount <= uVar8)) break;
    pPVar5 = ParseNode::AsParseNodeBin(args);
    OVar1 = pPVar5->pnode1->nop;
    if (OVar1 == knopFlt) {
LAB_00769b3b:
      pPVar5 = ParseNode::AsParseNodeBin(args);
      pPVar7 = ParseNode::AsParseNodeFloat(pPVar5->pnode1);
      dVar9 = pPVar7->dbl;
    }
    else {
      if (OVar1 != knopInt) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1e6b,"(nop == knopFlt)","nop == knopFlt");
        if (bVar3) {
          *puVar4 = 0;
          goto LAB_00769b3b;
        }
        goto LAB_00769c2d;
      }
      pPVar5 = ParseNode::AsParseNodeBin(args);
      pPVar6 = ParseNode::AsParseNodeInt(pPVar5->pnode1);
      dVar9 = (double)pPVar6->lw;
    }
    vars[uVar8] = dVar9;
    uVar8 = uVar8 + 1;
    pPVar5 = ParseNode::AsParseNodeBin(args);
    args = pPVar5->pnode2;
  }
  if (argCount <= uVar8) {
    Js::Throw::InternalError();
  }
  if (OVar1 == knopFlt) {
LAB_00769bc7:
    pPVar7 = ParseNode::AsParseNodeFloat(args);
    dVar9 = pPVar7->dbl;
  }
  else {
    if (OVar1 != knopInt) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1e7d,"(args->nop == knopFlt)","args->nop == knopFlt");
      if (!bVar3) goto LAB_00769c2d;
      *puVar4 = 0;
      goto LAB_00769bc7;
    }
    pPVar6 = ParseNode::AsParseNodeInt(args);
    dVar9 = (double)pPVar6->lw;
  }
  vars[uVar8] = dVar9;
  if (argCount - 1 != (int)uVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1e81,"(index == argCount)","index == argCount");
    if (!bVar3) {
LAB_00769c2d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void EmitConstantArgsToFltArray(ByteCodeGenerator *byteCodeGenerator, __out_ecount(argCount) double *vars, ParseNode *args, uint argCount)
{
    uint index = 0;
    while (args->nop == knopList && index < argCount)
    {
        OpCode nop = args->AsParseNodeBin()->pnode1->nop;
        if (nop == knopInt)
        {
            vars[index++] = (double)args->AsParseNodeBin()->pnode1->AsParseNodeInt()->lw;
        }
        else
        {
            Assert(nop == knopFlt);
            vars[index++] = args->AsParseNodeBin()->pnode1->AsParseNodeFloat()->dbl;
        }
        args = args->AsParseNodeBin()->pnode2;
    }

    if (index >= argCount)
    {
        Js::Throw::InternalError();
        return;
    }

    if (args->nop == knopInt)
    {
        vars[index++] = (double)args->AsParseNodeInt()->lw;
    }
    else
    {
        Assert(args->nop == knopFlt);
        vars[index++] = args->AsParseNodeFloat()->dbl;
    }

    Assert(index == argCount);
}